

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_based_vad.cc
# Opt level: O0

int __thiscall webrtc::PitchBasedVad::UpdatePrior(PitchBasedVad *this,double p)

{
  int iVar1;
  pointer pVVar2;
  double dVar3;
  double p_local;
  PitchBasedVad *this_local;
  
  pVVar2 = std::
           unique_ptr<webrtc::VadCircularBuffer,_std::default_delete<webrtc::VadCircularBuffer>_>::
           operator->(&this->circular_buffer_);
  VadCircularBuffer::Insert(pVVar2,p);
  pVVar2 = std::
           unique_ptr<webrtc::VadCircularBuffer,_std::default_delete<webrtc::VadCircularBuffer>_>::
           operator->(&this->circular_buffer_);
  iVar1 = VadCircularBuffer::RemoveTransient(pVVar2,7,0.2);
  if (iVar1 < 0) {
    this_local._4_4_ = -1;
  }
  else {
    pVVar2 = std::
             unique_ptr<webrtc::VadCircularBuffer,_std::default_delete<webrtc::VadCircularBuffer>_>
             ::operator->(&this->circular_buffer_);
    dVar3 = VadCircularBuffer::Mean(pVVar2);
    this->p_prior_ = dVar3;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int PitchBasedVad::UpdatePrior(double p) {
  circular_buffer_->Insert(p);
  if (circular_buffer_->RemoveTransient(kTransientWidthThreshold,
                                        kLowProbabilityThreshold) < 0)
    return -1;
  p_prior_ = circular_buffer_->Mean();
  return 0;
}